

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::InputFile::Data::readPixels(Data *this,int scanLine1,int scanLine2)

{
  bool bVar1;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  int in_stack_000000e8;
  int in_stack_000000ec;
  Data *in_stack_000000f0;
  int in_stack_000002e8;
  int in_stack_000002ec;
  CompositeDeepScanLine *in_stack_000002f0;
  mutex_type *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  ScanLineInputFile *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
                      *)0x1c60d3);
  if (bVar1) {
    std::
    unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
    ::operator->((unique_ptr<Imf_3_3::CompositeDeepScanLine,_std::default_delete<Imf_3_3::CompositeDeepScanLine>_>
                  *)0x1c60e7);
    CompositeDeepScanLine::readPixels(in_stack_000002f0,in_stack_000002ec,in_stack_000002e8);
  }
  else if (*(int *)((long)&in_RDI[6]._M_device + 4) == 1) {
    bufferedReadPixels(in_stack_000000f0,in_stack_000000ec,in_stack_000000e8);
  }
  else {
    std::unique_ptr<Imf_3_3::ScanLineInputFile,_std::default_delete<Imf_3_3::ScanLineInputFile>_>::
    operator->((unique_ptr<Imf_3_3::ScanLineInputFile,_std::default_delete<Imf_3_3::ScanLineInputFile>_>
                *)0x1c6144);
    ScanLineInputFile::readPixels
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1c6164);
  return;
}

Assistant:

void
InputFile::Data::readPixels (int scanLine1, int scanLine2)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_mx);
#endif

    if (_compositor) { _compositor->readPixels (scanLine1, scanLine2); }
    else if (_storage == EXR_STORAGE_TILED)
    {
        bufferedReadPixels (scanLine1, scanLine2);
    }
    else { _sFile->readPixels (scanLine1, scanLine2); }
}